

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O1

bool __thiscall irr::gui::CGUIEditBox::processKey(CGUIEditBox *this,SEvent *event)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  size_type *psVar3;
  byte bVar4;
  u32 uVar5;
  pointer psVar6;
  u32 uVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  u32 uVar11;
  uint uVar12;
  uint uVar13;
  undefined4 extraout_var;
  long lVar14;
  long lVar15;
  uint end;
  wchar_t c;
  ulong uVar16;
  pointer piVar17;
  long *plVar18;
  int iVar19;
  uint uVar20;
  uint begin;
  stringw s_1;
  stringw s;
  string<wchar_t> local_b0;
  stringw local_90;
  wstring *local_58;
  string<wchar_t> local_50;
  
  bVar4 = (event->field_1).field13[0xc];
  if ((bVar4 & 1) == 0) {
    return false;
  }
  begin = this->MarkBegin;
  end = this->MarkEnd;
  c = (event->field_1).KeyInput.Char;
  if ((bVar4 & 4) != 0) {
    if (c != L'\\') {
      iVar10 = (event->field_1).MouseInput.Y;
      if (iVar10 < 0x43) {
        if (iVar10 == 0x23) {
          if ((bVar4 & 2) != 0) {
            end = *(uint *)&this->field_0xb0;
            begin = this->CursorPos;
            this->CursorPos = 0;
            goto LAB_00216ce4;
          }
          this->CursorPos = *(s32 *)&this->field_0xb0;
LAB_002167f1:
          end = 0;
        }
        else if (iVar10 == 0x24) {
          if ((bVar4 & 2) == 0) {
            this->CursorPos = 0;
            goto LAB_002167f1;
          }
          end = this->CursorPos;
          this->CursorPos = 0;
        }
        else {
          if (iVar10 != 0x41) {
            return false;
          }
          end = *(uint *)&this->field_0xb0;
        }
        begin = 0;
      }
      else if (iVar10 == 0x43) {
        if ((this->PasswordBox == false) && (begin != end && this->Operator != (IOSOperator *)0x0))
        {
          uVar11 = end;
          if ((int)begin < (int)end) {
            uVar11 = begin;
          }
          paVar2 = &local_90.str.field_2;
          local_90.str._M_string_length = 0;
          local_90.str.field_2._M_allocated_capacity =
               (ulong)(uint7)local_90.str.field_2._M_allocated_capacity._1_7_ << 8;
          lVar15 = (long)(int)begin - (long)(int)end;
          lVar14 = -lVar15;
          if (0 < lVar15) {
            lVar14 = lVar15;
          }
          local_90.str._M_dataplus._M_p = (pointer)paVar2;
          core::string<wchar_t>::subString
                    (&local_b0,(string<wchar_t> *)&this->field_0xa8,uVar11,(s32)lVar14,false);
          core::wStringToUTF8((stringc *)&local_90,local_b0.str._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_b0.str._M_dataplus._M_p != &local_b0.str.field_2) {
            operator_delete(local_b0.str._M_dataplus._M_p,
                            CONCAT44(local_b0.str.field_2._M_local_buf[1],
                                     local_b0.str.field_2._M_local_buf[0]) * 4 + 4);
          }
          (*this->Operator->_vptr_IOSOperator[1])(this->Operator,local_90.str._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_90.str._M_dataplus._M_p != paVar2) {
LAB_00216cac:
            operator_delete(local_90.str._M_dataplus._M_p,
                            local_90.str.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else if (iVar10 == 0x56) {
        cVar8 = (**(code **)(*(long *)this + 0x90))(this);
        if ((cVar8 != '\0') && (this->Operator != (IOSOperator *)0x0)) {
          uVar11 = this->MarkBegin;
          uVar5 = this->MarkEnd;
          uVar7 = uVar5;
          if ((int)uVar11 < (int)uVar5) {
            uVar7 = uVar11;
          }
          if ((int)uVar5 < (int)uVar11) {
            uVar5 = uVar11;
          }
          iVar10 = (*this->Operator->_vptr_IOSOperator[3])();
          if ((char *)CONCAT44(extraout_var,iVar10) != (char *)0x0) {
            local_90.str._M_dataplus._M_p = (pointer)&local_90.str.field_2;
            local_90.str._M_string_length = 0;
            local_90.str.field_2._M_allocated_capacity =
                 local_90.str.field_2._M_allocated_capacity & 0xffffffff00000000;
            core::utf8ToWString(&local_90,(char *)CONCAT44(extraout_var,iVar10));
            puVar1 = &this->field_0xa8;
            if (this->MarkBegin == this->MarkEnd) {
              core::string<wchar_t>::subString
                        (&local_b0,(string<wchar_t> *)puVar1,0,this->CursorPos,false);
              ::std::__cxx11::wstring::_M_append
                        ((wchar_t *)&local_b0,(ulong)local_90.str._M_dataplus._M_p);
              core::string<wchar_t>::subString
                        (&local_50,(string<wchar_t> *)puVar1,this->CursorPos,
                         *(int *)&this->field_0xb0 - this->CursorPos,false);
              ::std::__cxx11::wstring::_M_append
                        ((wchar_t *)&local_b0,(ulong)local_50.str._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
                operator_delete(local_50.str._M_dataplus._M_p,
                                local_50.str.field_2._M_allocated_capacity * 4 + 4);
              }
              if ((this->Max == 0) || ((uint)local_b0.str._M_string_length <= this->Max)) {
                if ((string<wchar_t> *)puVar1 != &local_b0) {
                  ::std::__cxx11::wstring::_M_assign((wstring *)puVar1);
                }
                ::std::__cxx11::wstring::_M_assign((wstring *)&local_b0);
                this->CursorPos = this->CursorPos + (uint)local_b0.str._M_string_length;
              }
            }
            else {
              core::string<wchar_t>::subString(&local_b0,(string<wchar_t> *)puVar1,0,uVar7,false);
              ::std::__cxx11::wstring::_M_append
                        ((wchar_t *)&local_b0,(ulong)local_90.str._M_dataplus._M_p);
              core::string<wchar_t>::subString
                        (&local_50,(string<wchar_t> *)puVar1,uVar5,*(int *)&this->field_0xb0 - uVar5
                         ,false);
              ::std::__cxx11::wstring::_M_append
                        ((wchar_t *)&local_b0,(ulong)local_50.str._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
                operator_delete(local_50.str._M_dataplus._M_p,
                                local_50.str.field_2._M_allocated_capacity * 4 + 4);
              }
              if ((this->Max == 0) || ((uint)local_b0.str._M_string_length <= this->Max)) {
                if ((string<wchar_t> *)puVar1 != &local_b0) {
                  ::std::__cxx11::wstring::_M_assign((wstring *)puVar1);
                }
                ::std::__cxx11::wstring::_M_assign((wstring *)&local_b0);
                this->CursorPos = uVar7 + (uint)local_b0.str._M_string_length;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_b0.str._M_dataplus._M_p != &local_b0.str.field_2) {
              operator_delete(local_b0.str._M_dataplus._M_p,
                              CONCAT44(local_b0.str.field_2._M_local_buf[1],
                                       local_b0.str.field_2._M_local_buf[0]) * 4 + 4);
            }
            goto LAB_00216f53;
          }
          goto LAB_00216f6f;
        }
      }
      else {
        if (iVar10 != 0x58) {
          return false;
        }
        if ((this->PasswordBox == false) && (begin != end && this->Operator != (IOSOperator *)0x0))
        {
          uVar11 = end;
          if ((int)begin < (int)end) {
            uVar11 = begin;
          }
          uVar5 = end;
          if ((int)end < (int)begin) {
            uVar5 = begin;
          }
          local_90.str._M_dataplus._M_p = (pointer)&local_90.str.field_2;
          local_90.str._M_string_length = 0;
          local_90.str.field_2._M_allocated_capacity =
               (ulong)(uint7)local_90.str.field_2._M_allocated_capacity._1_7_ << 8;
          local_58 = (wstring *)&this->field_0xa8;
          lVar15 = (long)(int)begin - (long)(int)end;
          lVar14 = -lVar15;
          if (0 < lVar15) {
            lVar14 = lVar15;
          }
          core::string<wchar_t>::subString
                    (&local_b0,(string<wchar_t> *)local_58,uVar11,(s32)lVar14,false);
          core::wStringToUTF8((stringc *)&local_90,local_b0.str._M_dataplus._M_p);
          paVar2 = &local_b0.str.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_b0.str._M_dataplus._M_p != paVar2) {
            operator_delete(local_b0.str._M_dataplus._M_p,
                            CONCAT44(local_b0.str.field_2._M_local_buf[1],
                                     local_b0.str.field_2._M_local_buf[0]) * 4 + 4);
          }
          (*this->Operator->_vptr_IOSOperator[1])(this->Operator,local_90.str._M_dataplus._M_p);
          cVar8 = (**(code **)(*(long *)this + 0x90))(this);
          if (cVar8 != '\0') {
            local_b0.str._M_string_length = 0;
            local_b0.str.field_2._M_local_buf[0] = L'\0';
            local_b0.str._M_dataplus._M_p = (pointer)paVar2;
            core::string<wchar_t>::subString(&local_50,(string<wchar_t> *)local_58,0,uVar11,false);
            ::std::__cxx11::wstring::_M_assign((wstring *)&local_b0);
            paVar2 = &local_50.str.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_50.str._M_dataplus._M_p != paVar2) {
              operator_delete(local_50.str._M_dataplus._M_p,
                              local_50.str.field_2._M_allocated_capacity * 4 + 4);
            }
            core::string<wchar_t>::subString
                      (&local_50,(string<wchar_t> *)local_58,uVar5,*(int *)&this->field_0xb0 - uVar5
                       ,false);
            ::std::__cxx11::wstring::_M_append
                      ((wchar_t *)&local_b0,(ulong)local_50.str._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_50.str._M_dataplus._M_p != paVar2) {
              operator_delete(local_50.str._M_dataplus._M_p,
                              local_50.str.field_2._M_allocated_capacity * 4 + 4);
            }
            if (local_58 != (wstring *)&local_b0) {
              ::std::__cxx11::wstring::_M_assign(local_58);
            }
            this->CursorPos = uVar11;
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_b0.str._M_dataplus._M_p != &local_b0.str.field_2) {
              operator_delete(local_b0.str._M_dataplus._M_p,
                              CONCAT44(local_b0.str.field_2._M_local_buf[1],
                                       local_b0.str.field_2._M_local_buf[0]) * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_90.str._M_dataplus._M_p != &local_90.str.field_2) {
              uVar16 = local_90.str.field_2._M_allocated_capacity + 1;
              goto LAB_00216f6a;
            }
            goto LAB_00216f6f;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_90.str._M_dataplus._M_p != &local_90.str.field_2) goto LAB_00216cac;
        }
      }
      goto LAB_00216ce4;
    }
    c = L'\\';
LAB_00216446:
    inputChar(this,c);
    goto LAB_00216cf9;
  }
  iVar10 = (event->field_1).MouseInput.Y;
  bVar9 = false;
  if (c != L'\0') {
    if (iVar10 - 0x70U < 0x18) {
      return false;
    }
    switch(iVar10) {
    case 8:
      cVar8 = (**(code **)(*(long *)this + 0x90))(this);
      if ((cVar8 != '\0') && (*(int *)&this->field_0xb0 != 0)) {
        puVar1 = &this->field_0xa8;
        local_90.str._M_dataplus._M_p = (pointer)&local_90.str.field_2;
        local_90.str._M_string_length = 0;
        local_90.str.field_2._M_allocated_capacity =
             local_90.str.field_2._M_allocated_capacity & 0xffffffff00000000;
        uVar11 = this->MarkBegin;
        uVar5 = this->MarkEnd;
        if (uVar11 == uVar5) {
          if (this->CursorPos < 1) {
            core::string<wchar_t>::operator=(&local_90,L"");
          }
          else {
            core::string<wchar_t>::subString
                      (&local_b0,(string<wchar_t> *)puVar1,0,this->CursorPos + -1,false);
            ::std::__cxx11::wstring::_M_assign((wstring *)&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_b0.str._M_dataplus._M_p != &local_b0.str.field_2) {
              operator_delete(local_b0.str._M_dataplus._M_p,
                              CONCAT44(local_b0.str.field_2._M_local_buf[1],
                                       local_b0.str.field_2._M_local_buf[0]) * 4 + 4);
            }
          }
          core::string<wchar_t>::subString
                    (&local_b0,(string<wchar_t> *)puVar1,this->CursorPos,
                     *(int *)&this->field_0xb0 - this->CursorPos,false);
          ::std::__cxx11::wstring::_M_append
                    ((wchar_t *)&local_90,(ulong)local_b0.str._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_b0.str._M_dataplus._M_p != &local_b0.str.field_2) {
            operator_delete(local_b0.str._M_dataplus._M_p,
                            CONCAT44(local_b0.str.field_2._M_local_buf[1],
                                     local_b0.str.field_2._M_local_buf[0]) * 4 + 4);
          }
          if ((stringw *)puVar1 != &local_90) {
            ::std::__cxx11::wstring::_M_assign((wstring *)puVar1);
          }
          this->CursorPos = this->CursorPos + -1;
        }
        else {
          uVar7 = uVar5;
          if ((int)uVar11 < (int)uVar5) {
            uVar7 = uVar11;
          }
          if ((int)uVar5 < (int)uVar11) {
            uVar5 = uVar11;
          }
          core::string<wchar_t>::subString(&local_b0,(string<wchar_t> *)puVar1,0,uVar7,false);
          ::std::__cxx11::wstring::_M_assign((wstring *)&local_90);
          paVar2 = &local_b0.str.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_b0.str._M_dataplus._M_p != paVar2) {
            operator_delete(local_b0.str._M_dataplus._M_p,
                            CONCAT44(local_b0.str.field_2._M_local_buf[1],
                                     local_b0.str.field_2._M_local_buf[0]) * 4 + 4);
          }
          core::string<wchar_t>::subString
                    (&local_b0,(string<wchar_t> *)puVar1,uVar5,*(int *)&this->field_0xb0 - uVar5,
                     false);
          ::std::__cxx11::wstring::_M_append
                    ((wchar_t *)&local_90,(ulong)local_b0.str._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_b0.str._M_dataplus._M_p != paVar2) {
            operator_delete(local_b0.str._M_dataplus._M_p,
                            CONCAT44(local_b0.str.field_2._M_local_buf[1],
                                     local_b0.str.field_2._M_local_buf[0]) * 4 + 4);
          }
          if ((stringw *)puVar1 != &local_90) {
            ::std::__cxx11::wstring::_M_assign((wstring *)puVar1);
          }
          this->CursorPos = uVar7;
        }
        if (this->CursorPos < 0) {
          this->CursorPos = 0;
        }
        uVar11 = os::Timer::getTime();
        this->BlinkStartTime = uVar11;
LAB_00216f53:
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_90.str._M_dataplus._M_p != &local_90.str.field_2) {
          uVar16 = local_90.str.field_2._M_allocated_capacity * 4 + 4;
LAB_00216f6a:
          operator_delete(local_90.str._M_dataplus._M_p,uVar16);
        }
        goto LAB_00216f6f;
      }
      goto LAB_00216ce4;
    case 9:
    case 0x10:
      goto switchD_00216386_caseD_9;
    case 0xd:
      if (this->MultiLine != true) {
        calculateScrollPos(this);
        plVar18 = *(long **)&this->field_0x20;
        if (plVar18 == (long *)0x0) {
          return true;
        }
        local_90.str.field_2._M_local_buf[2] = L'\x0e';
        goto LAB_00216fb9;
      }
      c = L'\n';
      break;
    default:
      if (iVar10 == 0x1b) {
        return false;
      }
      if ((iVar10 == 0x2e) && (c == L'\x7f')) goto switchD_002164a0_caseD_2e;
    case 10:
    case 0xb:
    case 0xc:
    case 0xe:
    case 0xf:
    }
    goto LAB_00216446;
  }
  uVar13 = end;
  switch(iVar10) {
  case 0x23:
    if ((this->WordWrap == false) && (this->MultiLine != true)) {
      uVar13 = *(uint *)&this->field_0xb0;
    }
    else {
      uVar13 = getLineFromPos(this,this->CursorPos);
      iVar10 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar13];
      psVar3 = &(this->BrokenText).m_data.
                super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13].str._M_string_length;
      uVar13 = iVar10 + (int)*psVar3;
      if (uVar13 != 0 && SCARRY4(iVar10,(int)*psVar3) == (int)uVar13 < 0) {
        iVar10 = *(int *)(*(long *)&this->field_0xa8 + (ulong)(uVar13 - 1) * 4);
        if ((iVar10 == 0xd) || (iVar10 == 10)) {
          uVar13 = uVar13 - 1;
        }
      }
    }
    if (begin == end) {
      begin = this->CursorPos;
    }
    end = uVar13;
    if ((bVar4 & 2) == 0) {
      end = 0;
      begin = 0;
    }
    this->CursorPos = uVar13;
    goto LAB_00216c78;
  case 0x24:
    if ((this->WordWrap != false) || (uVar13 = 0, this->MultiLine == true)) {
      uVar13 = getLineFromPos(this,this->CursorPos);
      uVar13 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar13];
    }
    if (begin == end) {
      begin = this->CursorPos;
    }
    end = uVar13;
    if ((bVar4 & 2) == 0) {
      end = 0;
      begin = 0;
    }
    this->CursorPos = uVar13;
LAB_00216c78:
    uVar11 = os::Timer::getTime();
    this->BlinkStartTime = uVar11;
    break;
  case 0x25:
    uVar13 = 0;
    uVar20 = 0;
    if (((bVar4 & 2) != 0) &&
       (uVar12 = this->CursorPos, uVar13 = end, uVar20 = begin, 0 < (int)uVar12)) {
      if (begin == end) {
        begin = uVar12;
      }
      uVar13 = uVar12 - 1;
      uVar20 = begin;
    }
    end = uVar13;
    if (0 < this->CursorPos) {
      iVar10 = this->CursorPos + -1;
LAB_00216ccd:
      this->CursorPos = iVar10;
      end = uVar13;
    }
    goto LAB_00216cd3;
  case 0x26:
    if ((this->MultiLine == false) &&
       ((this->WordWrap != true ||
        (((long)(this->BrokenText).m_data.
                super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->BrokenText).m_data.
                super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_start & 0x1fffffffc0U) == 0)))) {
      return false;
    }
    uVar20 = this->CursorPos;
    uVar12 = getLineFromPos(this,uVar20);
    if (begin != end && (int)end <= (int)begin) {
      uVar13 = begin;
    }
    if (begin == end) {
      uVar13 = uVar20;
    }
    if (0 < (int)uVar12) {
      piVar17 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar19 = uVar20 - piVar17[uVar12];
      uVar16 = (ulong)(uVar12 - 1);
      iVar10 = (int)(this->BrokenText).m_data.
                    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar16].str._M_string_length;
LAB_00216b46:
      if (iVar10 < iVar19) {
        iVar19 = piVar17[uVar16] + iVar10 + (uint)(iVar10 == 0) + -1;
      }
      else {
        iVar19 = piVar17[uVar16] + iVar19;
      }
      this->CursorPos = iVar19;
    }
    goto LAB_00216bf7;
  case 0x27:
    uVar13 = 0;
    uVar20 = 0;
    if (((bVar4 & 2) != 0) &&
       (uVar12 = this->CursorPos, uVar13 = end, uVar20 = begin, uVar12 < *(uint *)&this->field_0xb0)
       ) {
      if (begin == end) {
        begin = uVar12;
      }
      uVar13 = uVar12 + 1;
      uVar20 = begin;
    }
    end = uVar13;
    if ((uint)this->CursorPos < *(uint *)&this->field_0xb0) {
      iVar10 = this->CursorPos + 1;
      goto LAB_00216ccd;
    }
LAB_00216cd3:
    uVar11 = os::Timer::getTime();
    this->BlinkStartTime = uVar11;
    begin = uVar20;
    break;
  case 0x28:
    if (this->MultiLine == false) {
      if (this->WordWrap != true) {
        return false;
      }
      if (((long)(this->BrokenText).m_data.
                 super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->BrokenText).m_data.
                 super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_start & 0x1fffffffc0U) == 0) {
        return false;
      }
    }
    uVar20 = this->CursorPos;
    uVar12 = getLineFromPos(this,uVar20);
    if ((int)begin < (int)end) {
      uVar13 = begin;
    }
    if (begin == end) {
      uVar13 = uVar20;
    }
    psVar6 = (this->BrokenText).m_data.
             super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)uVar12 <
        (int)((ulong)((long)(this->BrokenText).m_data.
                            super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6) >> 5) + -1) {
      piVar17 = (this->BrokenTextPositions).m_data.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar19 = uVar20 - piVar17[uVar12];
      uVar16 = (ulong)(uVar12 + 1);
      iVar10 = (int)psVar6[uVar16].str._M_string_length;
      goto LAB_00216b46;
    }
LAB_00216bf7:
    end = 0;
    begin = 0;
    if (((event->field_1).field13[0xc] & 2) != 0) {
      end = this->CursorPos;
      begin = uVar13;
    }
    break;
  default:
    goto switchD_00216386_caseD_9;
  case 0x2d:
    cVar8 = (**(code **)(*(long *)this + 0x90))(this);
    if (cVar8 != '\0') {
      this->OverwriteMode = (bool)(this->OverwriteMode ^ 1);
    }
    break;
  case 0x2e:
switchD_002164a0_caseD_2e:
    cVar8 = (**(code **)(*(long *)this + 0x90))(this);
    if ((cVar8 != '\0') && (bVar9 = keyDelete(this), bVar9)) {
      uVar11 = os::Timer::getTime();
      this->BlinkStartTime = uVar11;
LAB_00216f6f:
      setTextMarkers(this,0,0);
      breakText(this);
      calculateScrollPos(this);
      plVar18 = *(long **)&this->field_0x20;
      if (plVar18 == (long *)0x0) {
        return true;
      }
      local_90.str.field_2._M_local_buf[2] = L'\x0f';
LAB_00216fb9:
      local_90.str.field_2._M_allocated_capacity = 0;
      local_90.str._M_dataplus._M_p = local_90.str._M_dataplus._M_p & 0xffffffff00000000;
      local_90.str._M_string_length = (size_type)this;
      (**(code **)(*plVar18 + 0x10))();
      return true;
    }
  }
LAB_00216ce4:
  setTextMarkers(this,begin,end);
  calculateScrollPos(this);
LAB_00216cf9:
  bVar9 = true;
switchD_00216386_caseD_9:
  return bVar9;
}

Assistant:

bool CGUIEditBox::processKey(const SEvent &event)
{
	if (!event.KeyInput.PressedDown)
		return false;

	bool textChanged = false;
	s32 newMarkBegin = MarkBegin;
	s32 newMarkEnd = MarkEnd;

	// control shortcut handling

	if (event.KeyInput.Control) {
		// german backlash '\' entered with control + '?'
		if (event.KeyInput.Char == '\\') {
			inputChar(event.KeyInput.Char);
			return true;
		}

		switch (event.KeyInput.Key) {
		case KEY_KEY_A:
			// select all
			newMarkBegin = 0;
			newMarkEnd = Text.size();
			break;
		case KEY_KEY_C:
			// copy to clipboard
			if (!PasswordBox && Operator && MarkBegin != MarkEnd) {
				const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
				const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

				core::stringc s;
				wStringToUTF8(s, Text.subString(realmbgn, realmend - realmbgn));
				Operator->copyToClipboard(s.c_str());
			}
			break;
		case KEY_KEY_X:
			// cut to the clipboard
			if (!PasswordBox && Operator && MarkBegin != MarkEnd) {
				const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
				const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

				// copy
				core::stringc sc;
				wStringToUTF8(sc, Text.subString(realmbgn, realmend - realmbgn));
				Operator->copyToClipboard(sc.c_str());

				if (isEnabled()) {
					// delete
					core::stringw s;
					s = Text.subString(0, realmbgn);
					s.append(Text.subString(realmend, Text.size() - realmend));
					Text = s;

					CursorPos = realmbgn;
					newMarkBegin = 0;
					newMarkEnd = 0;
					textChanged = true;
				}
			}
			break;
		case KEY_KEY_V:
			if (!isEnabled())
				break;

			// paste from the clipboard
			if (Operator) {
				const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
				const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

				// add the string
				const c8 *p = Operator->getTextFromClipboard();
				if (p) {
					irr::core::stringw widep;
					core::utf8ToWString(widep, p);

					if (MarkBegin == MarkEnd) {
						// insert text
						core::stringw s = Text.subString(0, CursorPos);
						s.append(widep);
						s.append(Text.subString(CursorPos, Text.size() - CursorPos));

						if (!Max || s.size() <= Max) { // thx to Fish FH for fix
							Text = s;
							s = widep;
							CursorPos += s.size();
						}
					} else {
						// replace text

						core::stringw s = Text.subString(0, realmbgn);
						s.append(widep);
						s.append(Text.subString(realmend, Text.size() - realmend));

						if (!Max || s.size() <= Max) { // thx to Fish FH for fix
							Text = s;
							s = widep;
							CursorPos = realmbgn + s.size();
						}
					}
				}

				newMarkBegin = 0;
				newMarkEnd = 0;
				textChanged = true;
			}
			break;
		case KEY_HOME:
			// move/highlight to start of text
			if (event.KeyInput.Shift) {
				newMarkEnd = CursorPos;
				newMarkBegin = 0;
				CursorPos = 0;
			} else {
				CursorPos = 0;
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			break;
		case KEY_END:
			// move/highlight to end of text
			if (event.KeyInput.Shift) {
				newMarkBegin = CursorPos;
				newMarkEnd = Text.size();
				CursorPos = 0;
			} else {
				CursorPos = Text.size();
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			break;
		default:
			return false;
		}
	}
	// Some special keys - but only handle them if KeyInput.Char is null as on some systems (X11) they might have same key-code as ansi-keys otherwise
	else if (event.KeyInput.Char == 0) {
		switch (event.KeyInput.Key) {
		case KEY_END: {
			s32 p = Text.size();
			if (WordWrap || MultiLine) {
				p = getLineFromPos(CursorPos);
				p = BrokenTextPositions[p] + (s32)BrokenText[p].size();
				if (p > 0 && (Text[p - 1] == L'\r' || Text[p - 1] == L'\n'))
					p -= 1;
			}

			if (event.KeyInput.Shift) {
				if (MarkBegin == MarkEnd)
					newMarkBegin = CursorPos;

				newMarkEnd = p;
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			CursorPos = p;
			BlinkStartTime = os::Timer::getTime();
		} break;
		case KEY_HOME: {

			s32 p = 0;
			if (WordWrap || MultiLine) {
				p = getLineFromPos(CursorPos);
				p = BrokenTextPositions[p];
			}

			if (event.KeyInput.Shift) {
				if (MarkBegin == MarkEnd)
					newMarkBegin = CursorPos;
				newMarkEnd = p;
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}
			CursorPos = p;
			BlinkStartTime = os::Timer::getTime();
		} break;
		case KEY_LEFT:

			if (event.KeyInput.Shift) {
				if (CursorPos > 0) {
					if (MarkBegin == MarkEnd)
						newMarkBegin = CursorPos;

					newMarkEnd = CursorPos - 1;
				}
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}

			if (CursorPos > 0)
				CursorPos--;
			BlinkStartTime = os::Timer::getTime();
			break;

		case KEY_RIGHT:
			if (event.KeyInput.Shift) {
				if (Text.size() > (u32)CursorPos) {
					if (MarkBegin == MarkEnd)
						newMarkBegin = CursorPos;

					newMarkEnd = CursorPos + 1;
				}
			} else {
				newMarkBegin = 0;
				newMarkEnd = 0;
			}

			if (Text.size() > (u32)CursorPos)
				CursorPos++;
			BlinkStartTime = os::Timer::getTime();
			break;
		case KEY_UP:
			if (MultiLine || (WordWrap && BrokenText.size() > 1)) {
				s32 lineNo = getLineFromPos(CursorPos);
				s32 mb = (MarkBegin == MarkEnd) ? CursorPos : (MarkBegin > MarkEnd ? MarkBegin : MarkEnd);
				if (lineNo > 0) {
					s32 cp = CursorPos - BrokenTextPositions[lineNo];
					if ((s32)BrokenText[lineNo - 1].size() < cp)
						CursorPos = BrokenTextPositions[lineNo - 1] + core::max_((u32)1, BrokenText[lineNo - 1].size()) - 1;
					else
						CursorPos = BrokenTextPositions[lineNo - 1] + cp;
				}

				if (event.KeyInput.Shift) {
					newMarkBegin = mb;
					newMarkEnd = CursorPos;
				} else {
					newMarkBegin = 0;
					newMarkEnd = 0;
				}

			} else {
				return false;
			}
			break;
		case KEY_DOWN:
			if (MultiLine || (WordWrap && BrokenText.size() > 1)) {
				s32 lineNo = getLineFromPos(CursorPos);
				s32 mb = (MarkBegin == MarkEnd) ? CursorPos : (MarkBegin < MarkEnd ? MarkBegin : MarkEnd);
				if (lineNo < (s32)BrokenText.size() - 1) {
					s32 cp = CursorPos - BrokenTextPositions[lineNo];
					if ((s32)BrokenText[lineNo + 1].size() < cp)
						CursorPos = BrokenTextPositions[lineNo + 1] + core::max_((u32)1, BrokenText[lineNo + 1].size()) - 1;
					else
						CursorPos = BrokenTextPositions[lineNo + 1] + cp;
				}

				if (event.KeyInput.Shift) {
					newMarkBegin = mb;
					newMarkEnd = CursorPos;
				} else {
					newMarkBegin = 0;
					newMarkEnd = 0;
				}

			} else {
				return false;
			}
			break;
		case KEY_INSERT:
			if (!isEnabled())
				break;

			OverwriteMode = !OverwriteMode;
			break;
		case KEY_DELETE:
			if (!isEnabled())
				break;

			if (keyDelete()) {
				BlinkStartTime = os::Timer::getTime();
				newMarkBegin = 0;
				newMarkEnd = 0;
				textChanged = true;
			}
			break;
		default:
			return false;
		}
	} else {
		// default keyboard handling
		switch (event.KeyInput.Key) {
		case KEY_RETURN:
			if (MultiLine) {
				inputChar(L'\n');
			} else {
				calculateScrollPos();
				sendGuiEvent(EGET_EDITBOX_ENTER);
			}
			return true;

		case KEY_BACK:
			if (!isEnabled())
				break;

			if (Text.size()) {
				core::stringw s;

				if (MarkBegin != MarkEnd) {
					// delete marked text
					const s32 realmbgn = MarkBegin < MarkEnd ? MarkBegin : MarkEnd;
					const s32 realmend = MarkBegin < MarkEnd ? MarkEnd : MarkBegin;

					s = Text.subString(0, realmbgn);
					s.append(Text.subString(realmend, Text.size() - realmend));
					Text = s;

					CursorPos = realmbgn;
				} else {
					// delete text behind cursor
					if (CursorPos > 0)
						s = Text.subString(0, CursorPos - 1);
					else
						s = L"";
					s.append(Text.subString(CursorPos, Text.size() - CursorPos));
					Text = s;
					--CursorPos;
				}

				if (CursorPos < 0)
					CursorPos = 0;
				BlinkStartTime = os::Timer::getTime();
				newMarkBegin = 0;
				newMarkEnd = 0;
				textChanged = true;
			}
			break;

		case KEY_DELETE:

			// At least on X11 we get a char with 127 when the delete key is pressed.
			// We get no char when the delete key on numkeys is pressed with numlock off (handled in the other case calling keyDelete as Char is then 0).
			// We get a keykode != 127 when delete key on numlock is pressed with numlock on.
			if (event.KeyInput.Char == 127) {
				if (!isEnabled())
					break;

				if (keyDelete()) {
					BlinkStartTime = os::Timer::getTime();
					newMarkBegin = 0;
					newMarkEnd = 0;
					textChanged = true;
				}
				break;
			} else {
				inputChar(event.KeyInput.Char);
				return true;
			}

		case KEY_ESCAPE:
		case KEY_TAB:
		case KEY_SHIFT:
		case KEY_F1:
		case KEY_F2:
		case KEY_F3:
		case KEY_F4:
		case KEY_F5:
		case KEY_F6:
		case KEY_F7:
		case KEY_F8:
		case KEY_F9:
		case KEY_F10:
		case KEY_F11:
		case KEY_F12:
		case KEY_F13:
		case KEY_F14:
		case KEY_F15:
		case KEY_F16:
		case KEY_F17:
		case KEY_F18:
		case KEY_F19:
		case KEY_F20:
		case KEY_F21:
		case KEY_F22:
		case KEY_F23:
		case KEY_F24:
			// ignore these keys
			return false;

		default:
			inputChar(event.KeyInput.Char);
			return true;
		}
	}

	// Set new text markers
	setTextMarkers(newMarkBegin, newMarkEnd);

	// break the text if it has changed
	if (textChanged) {
		breakText();
		calculateScrollPos();
		sendGuiEvent(EGET_EDITBOX_CHANGED);
	} else {
		calculateScrollPos();
	}

	return true;
}